

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# rtmidi_c.cpp
# Opt level: O1

RtMidiInPtr rtmidi_in_create_default(void)

{
  RtMidiInPtr pRVar1;
  RtMidiIn *this;
  string local_48;
  
  pRVar1 = (RtMidiInPtr)operator_new(0x20);
  this = (RtMidiIn *)operator_new(0x10);
  local_48._M_dataplus._M_p = (pointer)&local_48.field_2;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_48,"RtMidi Input Client","");
  RtMidiIn::RtMidiIn(this,UNSPECIFIED,&local_48,100);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_48._M_dataplus._M_p != &local_48.field_2) {
    operator_delete(local_48._M_dataplus._M_p,local_48.field_2._M_allocated_capacity + 1);
  }
  pRVar1->ptr = this;
  pRVar1->data = (void *)0x0;
  pRVar1->ok = true;
  pRVar1->msg = "";
  return pRVar1;
}

Assistant:

RtMidiInPtr rtmidi_in_create_default ()
{
    RtMidiWrapper* wrp = new RtMidiWrapper;

    try {
        RtMidiIn* rIn = new RtMidiIn ();

        wrp->ptr = (void*) rIn;
        wrp->data = 0;
        wrp->ok  = true;
        wrp->msg = "";

    } catch (const RtMidiError & err) {
        wrp->ptr = 0;
        wrp->data = 0;
        wrp->ok  = false;
        wrp->msg = err.what ();
    }

    return wrp;
}